

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O0

void __thiscall pizza_cutter::try_to_create_slices_for_each_point(pizza_cutter *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference this_00;
  pizza_slice *ppVar4;
  undefined1 local_2c [4];
  int next_slice_id;
  optional<pizza_slice> slice;
  int col;
  int row;
  pizza_cutter *this_local;
  
  slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
  super__Optional_payload_base<pizza_slice>._M_engaged = false;
  slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
  super__Optional_payload_base<pizza_slice>._17_3_ = 0;
  for (; uVar2 = (ulong)(int)slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
                             super__Optional_payload_base<pizza_slice>._16_4_,
      sVar3 = std::
              vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
              ::size(&this->pizza_), uVar2 < sVar3;
      slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
      super__Optional_payload_base<pizza_slice>._16_4_ =
           slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
           super__Optional_payload_base<pizza_slice>._16_4_ + 1) {
    slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
    super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2 = 0;
    while( true ) {
      uVar2 = (ulong)slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
                     super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2;
      this_00 = std::
                vector<std::vector<pizza_cell,_std::allocator<pizza_cell>_>,_std::allocator<std::vector<pizza_cell,_std::allocator<pizza_cell>_>_>_>
                ::operator[](&this->pizza_,0);
      sVar3 = std::vector<pizza_cell,_std::allocator<pizza_cell>_>::size(this_00);
      if (sVar3 <= uVar2) break;
      create_slice_for((optional<pizza_slice> *)local_2c,this,
                       slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
                       super__Optional_payload_base<pizza_slice>._16_4_,
                       slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
                       super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_2c);
      if (bVar1) {
        sVar3 = std::vector<pizza_slice,_std::allocator<pizza_slice>_>::size(&this->slices_);
        ppVar4 = std::optional<pizza_slice>::value((optional<pizza_slice> *)local_2c);
        mark_slice(this,*ppVar4,(int)sVar3);
        ppVar4 = std::optional<pizza_slice>::value((optional<pizza_slice> *)local_2c);
        std::vector<pizza_slice,_std::allocator<pizza_slice>_>::push_back(&this->slices_,ppVar4);
      }
      slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
      super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2 =
           slice.super__Optional_base<pizza_slice,_true,_true>._M_payload.
           super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2 + 1;
    }
  }
  return;
}

Assistant:

void pizza_cutter::try_to_create_slices_for_each_point() noexcept
{
    for (int row = 0; row < pizza_.size(); row++) {
        for (int col = 0; col < pizza_[0].size(); col++) {
            auto slice = create_slice_for(row, col);
            if (!slice) continue;
            int next_slice_id = slices_.size();
            mark_slice(slice.value(), next_slice_id);
            slices_.push_back(slice.value());
        }
    }
}